

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushStyleVar(ImGuiStyleVar idx,float val)

{
  ImGuiContext *pIVar1;
  ImVec2 local_34;
  undefined1 local_2c [8];
  ImGuiStyleMod backup;
  float *pvar;
  ImGuiContext *g;
  float val_local;
  ImGuiStyleVar idx_local;
  
  pIVar1 = GImGui;
  backup.PreviousValue = (ImVec2)GetStyleVarFloatAddr(idx);
  if (backup.PreviousValue != (ImVec2)0x0) {
    ImGuiStyleMod::ImGuiStyleMod((ImGuiStyleMod *)local_2c);
    local_2c._0_4_ = idx;
    ImVec2::ImVec2(&local_34,*(float *)backup.PreviousValue,0.0);
    stack0xffffffffffffffd8 = local_34;
    ImVector<ImGuiStyleMod>::push_back(&pIVar1->StyleModifiers,(value_type *)local_2c);
    *(float *)backup.PreviousValue = val;
    return;
  }
  __assert_fail("pvar != __null",
                "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                ,0x124d,"void ImGui::PushStyleVar(ImGuiStyleVar, float)");
}

Assistant:

void ImGui::PushStyleVar(ImGuiStyleVar idx, float val)
{
    ImGuiContext& g = *GImGui;
    float* pvar = GetStyleVarFloatAddr(idx);
    IM_ASSERT(pvar != NULL); // Called function with wrong-type? Variable is not a float.
    ImGuiStyleMod backup;
    backup.Var = idx;
    backup.PreviousValue = ImVec2(*pvar, 0.0f);
    g.StyleModifiers.push_back(backup);
    *pvar = val;
}